

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprPartidxExprLookup(Parse *pParse,Expr *pExpr,int iTarget)

{
  Vdbe *p_00;
  int p1;
  int local_3c;
  int ret;
  int addr;
  Vdbe *v;
  IndexedExpr *p;
  int iTarget_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  v = (Vdbe *)pParse->pIdxPartExpr;
  while( true ) {
    if (v == (Vdbe *)0x0) {
      return 0;
    }
    if (((int)pExpr->iColumn == *(int *)&v->pVNext) && (pExpr->iTable == *(int *)&v->ppVPrev))
    break;
    v = (Vdbe *)v->pParse;
  }
  p_00 = pParse->pVdbe;
  local_3c = 0;
  if (*(char *)((long)&v->pVNext + 4) != '\0') {
    local_3c = sqlite3VdbeAddOp1(p_00,0x14,*(int *)((long)&v->ppVPrev + 4));
  }
  p1 = sqlite3ExprCodeTarget(pParse,(Expr *)v->db,iTarget);
  sqlite3VdbeAddOp4(pParse->pVdbe,0x60,p1,1,0,(char *)((long)&v->pVNext + 5),1);
  if (local_3c == 0) {
    return p1;
  }
  sqlite3VdbeJumpHere(p_00,local_3c);
  sqlite3VdbeChangeP3(p_00,local_3c,p1);
  return p1;
}

Assistant:

static int exprPartidxExprLookup(Parse *pParse, Expr *pExpr, int iTarget){
  IndexedExpr *p;
  for(p=pParse->pIdxPartExpr; p; p=p->pIENext){
    if( pExpr->iColumn==p->iIdxCol && pExpr->iTable==p->iDataCur ){
      Vdbe *v = pParse->pVdbe;
      int addr = 0;
      int ret;

      if( p->bMaybeNullRow ){
        addr = sqlite3VdbeAddOp1(v, OP_IfNullRow, p->iIdxCur);
      }
      ret = sqlite3ExprCodeTarget(pParse, p->pExpr, iTarget);
      sqlite3VdbeAddOp4(pParse->pVdbe, OP_Affinity, ret, 1, 0,
                        (const char*)&p->aff, 1);
      if( addr ){
        sqlite3VdbeJumpHere(v, addr);
        sqlite3VdbeChangeP3(v, addr, ret);
      }
      return ret;
    }
  }
  return 0;
}